

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall
PeleLM::advance_chemistry(PeleLM *this,MultiFab *mf_old,MultiFab *mf_new,Real dt,MultiFab *Force)

{
  Geometry *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
  *this_01;
  IntVect *this_02;
  int iVar1;
  Amr *pAVar2;
  pointer pIVar3;
  pointer pBVar4;
  pointer pBVar5;
  FabArray<amrex::FArrayBox> *pFVar6;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_03;
  bool bVar7;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> _Var8;
  PeleLM *pPVar9;
  int iVar10;
  Periodicity *pPVar11;
  mapped_type *pmVar12;
  long lVar13;
  long lVar14;
  ostream *poVar15;
  Print *pPVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  ostringstream *poVar23;
  double *pdVar24;
  double *pdVar25;
  long lVar26;
  element_type *peVar27;
  pointer pcVar28;
  pointer pcVar29;
  long lVar30;
  long lVar31;
  double *pdVar32;
  double *pdVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  int j;
  long lVar38;
  pointer pcVar39;
  int k;
  bool bVar40;
  bool bVar41;
  double dVar42;
  Periodicity PVar43;
  double *local_d18;
  double *local_d10;
  double *local_cf8;
  double *local_cf0;
  undefined1 local_c98 [32];
  int local_c78;
  int local_c74;
  int local_c70;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_c58;
  PeleLM *local_c50;
  double local_c48;
  long local_c40;
  long local_c38;
  undefined **local_c30;
  long local_c28;
  long local_c20;
  long local_c18;
  long local_c10;
  long local_c08;
  DistributionMapping dm;
  Box local_be4;
  FabArray<amrex::FArrayBox> *local_bc8;
  Real time_chem;
  Real dt_incr;
  Array4<double> local_bb0;
  double local_b70;
  long local_b68;
  long local_b60;
  double *local_b58;
  long local_b50;
  Array4<double> local_b48;
  Array4<double> local_b08;
  Array4<double> local_ac8;
  MFIter Smfi;
  Array4<double> local_900;
  BoxArray ba;
  BoxArray cf_grids;
  Array4<int> local_7f0;
  MultiFab STemp;
  MultiFab diagTemp;
  MultiFab fcnCntTemp;
  MultiFab FTemp;
  FabArray<amrex::BaseFab<int>_> react_mask;
  
  local_b70 = amrex::ParallelDescriptor::second();
  if (avg_down_chem == true) {
    iVar10 = (this->super_NavierStokesBase).super_AmrLevel.level;
    pAVar2 = (this->super_NavierStokesBase).super_AmrLevel.parent;
    if (*(int *)&(pAVar2->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c <= iVar10)
    goto LAB_0019096e;
    bVar41 = *(long *)(*(long *)((long)(pAVar2->amr_level).
                                       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                       .
                                       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[(long)iVar10 + 1].
                                       _M_t.
                                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                + 0x170) + 0xd0 + (long)RhoYdot_Type * 0xe0) != 0;
  }
  else {
LAB_0019096e:
    bVar41 = false;
  }
  if (hack_nochem != 0) {
    amrex::MultiFab::Copy(mf_new,mf_old,first_spec,first_spec,0xb,0);
    amrex::MultiFab::Saxpy(mf_new,dt,Force,0,first_spec,10,0);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               (this->super_NavierStokesBase).super_AmrLevel.state.
               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start[RhoYdot_Type].new_data._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,0.0);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               (this->super_NavierStokesBase).super_AmrLevel.state.
               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start[FuncCount_Type].new_data._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,0.0);
    goto LAB_00191e53;
  }
  amrex::BoxArray::BoxArray(&cf_grids);
  if (bVar41) {
    amrex::BoxArray::operator=
              (&cf_grids,
               (BoxArray *)
               ((long)(((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
                      super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                      .
                      super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start
                      [(long)(this->super_NavierStokesBase).super_AmrLevel.level + 1]._M_t.
                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
               + 0xd8));
    amrex::BoxArray::coarsen(&cf_grids,&(this->super_NavierStokesBase).super_AmrLevel.fine_ratio);
  }
  local_c58._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (this->super_NavierStokesBase).super_AmrLevel.state.
       super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
       super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
       super__Vector_impl_data._M_start[RhoYdot_Type].new_data._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
  iVar10 = (mf_old->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0];
  iVar1 = (mf_new->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0];
  iVar21 = *(int *)((long)local_c58._M_t.
                          super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                          .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0);
  if (iVar10 < *(int *)((long)local_c58._M_t.
                              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                              .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0))
  {
    iVar21 = iVar10;
  }
  if (iVar1 < iVar21) {
    iVar21 = iVar1;
  }
  amrex::BoxArray::BoxArray
            (&ba,&(mf_new->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray);
  local_bc8 = &mf_new->super_FabArray<amrex::FArrayBox>;
  std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)&dm,
             (__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
             &(mf_new->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap);
  lVar35 = (long)*(int *)(amrex::ParallelContext::frames + 0x10) *
           (long)(anonymous_namespace)::chem_box_chop_threshold;
  bVar7 = lVar35 <= ((long)((ba.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)((ba.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x1c;
  local_d18._0_4_ = 1;
  peVar27 = ba.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_c50 = this;
  while (pPVar9 = local_c50, !bVar7) {
    iVar10 = (local_c50->super_NavierStokesBase).super_AmrLevel.level;
    pIVar3 = (((local_c50->super_NavierStokesBase).super_AmrLevel.parent)->super_AmrCore).
             super_AmrMesh.super_AmrInfo.max_grid_size.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar17 = (long)pIVar3[iVar10].vect[0] / (long)(int)local_d18;
    lVar31 = (long)pIVar3[iVar10].vect[1] / (long)(int)local_d18;
    iVar10 = pIVar3[iVar10].vect[2] / (int)local_d18;
    if ((((int)uVar17 < 0x10) || ((int)lVar31 < 0x10)) || (iVar10 < 0x10)) break;
    uVar17 = uVar17 & 0xffffffff;
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ =
         (uint7)(uVar17 >> 8) | (uint7)((ulong)(lVar31 << 0x20) >> 8);
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = (undefined1)uVar17;
    Smfi.fabArray._0_4_ = iVar10;
    bVar7 = false;
    uVar17 = 2;
    while ((-1 < (int)uVar17 &&
           (((long)(peVar27->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(peVar27->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x1c < lVar35))) {
      Smfi.tile_size.vect[uVar17 - 4] = Smfi.tile_size.vect[uVar17 - 4] / 2;
      amrex::BoxArray::maxSize(&ba,(IntVect *)&Smfi);
      bVar7 = (bool)(bVar7 | lVar35 <= ((long)((ba.m_ref.
                                                super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr)->m_abox).
                                              super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)((ba.m_ref.
                                               super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr)->m_abox).
                                             super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                             ._M_impl.super__Vector_impl_data._M_start) / 0x1c);
      uVar17 = (ulong)((int)uVar17 - 1);
      peVar27 = ba.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    local_d18._0_4_ = (int)local_d18 * 2;
  }
  getFuncCountDM((PeleLM *)&Smfi,(BoxArray *)local_c50,(int)&ba);
  std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)&dm,
             (__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)&Smfi);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&Smfi.fabArray);
  Smfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = 0;
  Smfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 1;
  Smfi.fabArray._0_4_ = 0;
  Smfi.fabArray._4_4_ = 0;
  Smfi.tile_size.vect[0] = 0;
  Smfi.tile_size.vect[1] = 0;
  Smfi.tile_size.vect[2] = 0;
  Smfi.flags = '\0';
  Smfi._29_3_ = 0;
  Smfi.currentIndex = 0;
  Smfi.beginIndex = 0;
  FTemp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)&PTR__FabFactory_006d8928;
  amrex::MultiFab::MultiFab
            (&STemp,&ba,&dm,0xc,0,(MFInfo *)&Smfi,(FabFactory<amrex::FArrayBox> *)&FTemp);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&Smfi.tile_size);
  Smfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = 0;
  Smfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 1;
  Smfi.fabArray._0_4_ = 0;
  Smfi.fabArray._4_4_ = 0;
  Smfi.tile_size.vect[0] = 0;
  Smfi.tile_size.vect[1] = 0;
  Smfi.tile_size.vect[2] = 0;
  Smfi.flags = '\0';
  Smfi._29_3_ = 0;
  Smfi.currentIndex = 0;
  Smfi.beginIndex = 0;
  fcnCntTemp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)&PTR__FabFactory_006d8928;
  amrex::MultiFab::MultiFab
            (&FTemp,&ba,&dm,(Force->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,0,
             (MFInfo *)&Smfi,(FabFactory<amrex::FArrayBox> *)&fcnCntTemp);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&Smfi.tile_size);
  iVar10 = first_spec;
  pPVar11 = amrex::Periodicity::NonPeriodic();
  amrex::FabArray<amrex::FArrayBox>::ParallelCopy
            (&STemp.super_FabArray<amrex::FArrayBox>,&mf_old->super_FabArray<amrex::FArrayBox>,
             iVar10,0,0xc,pPVar11,COPY);
  pPVar11 = amrex::Periodicity::NonPeriodic();
  amrex::FabArray<amrex::FArrayBox>::ParallelCopy
            (&FTemp.super_FabArray<amrex::FArrayBox>,&Force->super_FabArray<amrex::FArrayBox>,
             pPVar11,COPY);
  Smfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = 0;
  Smfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 1;
  Smfi.fabArray._0_4_ = 0;
  Smfi.fabArray._4_4_ = 0;
  Smfi.tile_size.vect[0] = 0;
  Smfi.tile_size.vect[1] = 0;
  Smfi.tile_size.vect[2] = 0;
  Smfi.flags = '\0';
  Smfi._29_3_ = 0;
  Smfi.currentIndex = 0;
  Smfi.beginIndex = 0;
  diagTemp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)&PTR__FabFactory_006d8928;
  amrex::MultiFab::MultiFab
            (&fcnCntTemp,&ba,&dm,1,0,(MFInfo *)&Smfi,(FabFactory<amrex::FArrayBox> *)&diagTemp);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&Smfi.tile_size);
  amrex::MultiFab::MultiFab(&diagTemp);
  amrex::FabArray<amrex::BaseFab<int>_>::FabArray(&react_mask);
  Smfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = 0;
  Smfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 1;
  Smfi.fabArray._0_4_ = 0;
  Smfi.fabArray._4_4_ = 0;
  Smfi.tile_size.vect[0] = 0;
  Smfi.tile_size.vect[1] = 0;
  Smfi.tile_size.vect[2] = 0;
  Smfi.flags = '\0';
  Smfi._29_3_ = 0;
  Smfi.currentIndex = 0;
  Smfi.beginIndex = 0;
  local_c98._0_8_ = &PTR__FabFactory_006d8c40;
  amrex::FabArray<amrex::BaseFab<int>_>::define
            (&react_mask,&ba,&dm,1,0,(MFInfo *)&Smfi,(FabFactory<amrex::BaseFab<int>_> *)local_c98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&Smfi.tile_size);
  pPVar11 = amrex::Periodicity::NonPeriodic();
  amrex::FabArray<amrex::BaseFab<int>_>::ParallelCopy
            (&react_mask,&(pPVar9->super_NavierStokesBase).ebmask,pPVar11,COPY);
  if (plot_reactions == true) {
    std::__cxx11::string::string((string *)local_c98,"REACTIONS",(allocator *)&local_bb0);
    this_01 = &pPVar9->auxDiag;
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
              ::operator[](this_01,(key_type *)local_c98);
    amrex::intersect((BoxArray *)&Smfi,&ba,
                     (BoxArray *)
                     ((long)&(((pmVar12->_M_t).
                               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                               .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                             super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8));
    pBVar4 = ((Smfi.tile_array)->super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pBVar5 = ((Smfi.tile_array)->super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_start;
    amrex::BoxArray::~BoxArray((BoxArray *)&Smfi);
    std::__cxx11::string::~string((string *)local_c98);
    if (pBVar4 == pBVar5) goto LAB_00190ffe;
    std::__cxx11::string::string((string *)local_c98,"REACTIONS",(allocator *)&local_b08);
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
              ::operator[](this_01,(key_type *)local_c98);
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = 0;
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 1;
    Smfi.fabArray._0_4_ = 0;
    Smfi.fabArray._4_4_ = 0;
    Smfi.tile_size.vect[0] = 0;
    Smfi.tile_size.vect[1] = 0;
    Smfi.tile_size.vect[2] = 0;
    Smfi.flags = '\0';
    Smfi._29_3_ = 0;
    Smfi.currentIndex = 0;
    Smfi.beginIndex = 0;
    local_bb0.p = (double *)&PTR__FabFactory_006d8928;
    amrex::MultiFab::define
              (&diagTemp,&ba,&dm,
               *(int *)((long)&(((pmVar12->_M_t).
                                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                                 .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                               super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 0xcc),0,
               (MFInfo *)&Smfi,(FabFactory<amrex::FArrayBox> *)&local_bb0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&Smfi.tile_size);
    std::__cxx11::string::~string((string *)local_c98);
    std::__cxx11::string::string((string *)&Smfi,"REACTIONS",(allocator *)local_c98);
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
              ::operator[](this_01,(key_type *)&Smfi);
    pFVar6 = &((pmVar12->_M_t).
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
              super_FabArray<amrex::FArrayBox>;
    pPVar11 = amrex::Periodicity::NonPeriodic();
    amrex::FabArray<amrex::FArrayBox>::ParallelCopy
              (&diagTemp.super_FabArray<amrex::FArrayBox>,pFVar6,pPVar11,COPY);
    std::__cxx11::string::~string((string *)&Smfi);
    bVar7 = true;
  }
  else {
LAB_00190ffe:
    bVar7 = false;
  }
  if (2 < NavierStokesBase::verbose) {
    poVar15 = amrex::OutStream();
    amrex::Print::Print((Print *)&Smfi,poVar15);
    this_02 = &Smfi.tile_size;
    std::operator<<((ostream *)this_02,"      PeleLM::advance_chemistry() FABs in tmp MF: ");
    std::ostream::operator<<
              (this_02,(int)(((long)((STemp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                      boxarray.m_ref.
                                      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)((STemp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                     boxarray.m_ref.
                                     super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr)->m_abox).
                                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data._M_start) / 0x1c));
    std::operator<<((ostream *)this_02,'\n');
    amrex::Print::~Print((Print *)&Smfi);
  }
  amrex::MFIter::MFIter(&Smfi,(FabArrayBase *)&STemp,true);
  while( true ) {
    if (Smfi.endIndex <= Smfi.currentIndex) break;
    amrex::MFIter::tilebox(&local_be4,&Smfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)local_c98,&STemp.super_FabArray<amrex::FArrayBox>,&Smfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_bb0,&STemp.super_FabArray<amrex::FArrayBox>,&Smfi,9);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_b08,&STemp.super_FabArray<amrex::FArrayBox>,&Smfi,10);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_ac8,&fcnCntTemp.super_FabArray<amrex::FArrayBox>,&Smfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_b48,&FTemp.super_FabArray<amrex::FArrayBox>,&Smfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_900,&FTemp.super_FabArray<amrex::FArrayBox>,&Smfi,9);
    amrex::FabArray<amrex::BaseFab<int>_>::array<amrex::BaseFab<int>,_0>
              (&local_7f0,&react_mask,&Smfi);
    local_c30 = (undefined **)local_bb0.p;
    local_c40 = (long)local_be4.smallend.vect[1];
    lVar35 = (long)local_be4.smallend.vect[2];
    local_c38 = CONCAT44(local_b48.kstride._4_4_,(int)local_b48.kstride) * 8;
    lVar31 = (long)local_be4.smallend.vect[0];
    local_c48 = (double)local_bb0.kstride;
    local_c28 = local_c98._16_8_ * 8;
    local_cf0 = (double *)
                ((lVar35 - local_b48.begin.z) * local_c38 +
                 (local_c40 - local_b48.begin.y) *
                 CONCAT44(local_b48.jstride._4_4_,(int)local_b48.jstride) * 8 + lVar31 * 8 +
                 (long)local_b48.begin.x * -8 + CONCAT44(local_b48.p._4_4_,(int)local_b48.p));
    local_cf8 = (double *)
                (local_c98._0_8_ +
                (lVar35 - local_c70) * local_c28 + (local_c40 - local_c74) * local_c98._8_8_ * 8 +
                lVar31 * 8 + (long)local_c78 * -8);
    local_b50 = (long)local_bb0.begin.z;
    local_b58 = local_900.p;
    local_c08 = local_900.jstride;
    local_b60 = local_900.kstride;
    local_c10 = (long)local_900.begin.y;
    local_b68 = (long)local_900.begin.z;
    local_c20 = (long)local_be4.bigend.vect[2];
    while (lVar20 = lVar35, lVar20 <= local_c20) {
      lVar13 = (lVar20 - local_b50) * local_bb0.kstride;
      lVar14 = (lVar20 - local_b68) * local_900.kstride;
      local_d18 = local_cf8;
      local_d10 = local_cf0;
      for (lVar35 = local_c40; lVar35 <= local_be4.bigend.vect[1]; lVar35 = lVar35 + 1) {
        if (local_be4.smallend.vect[0] <= local_be4.bigend.vect[0]) {
          lVar18 = (lVar35 - local_bb0.begin.y) * local_bb0.jstride;
          lVar19 = (lVar35 - local_c10) * local_900.jstride;
          pdVar33 = local_d18;
          lVar22 = lVar31;
          pdVar24 = local_d10;
          do {
            lVar36 = 9;
            pdVar32 = pdVar24;
            pdVar25 = pdVar33;
            while (bVar40 = lVar36 != 0, lVar36 = lVar36 + -1, bVar40) {
              *pdVar25 = *pdVar25 * 0.001;
              *pdVar32 = *pdVar32 * 0.001;
              pdVar32 = pdVar32 + local_b48.nstride;
              pdVar25 = pdVar25 + local_c98._24_8_;
            }
            local_bb0.p[lVar13 + lVar18 + (lVar22 - local_bb0.begin.x)] =
                 (double)((double)local_bb0.p[lVar13 + lVar18 + (lVar22 - local_bb0.begin.x)] * 10.0
                         );
            local_900.p[lVar14 + lVar19 + (lVar22 - local_900.begin.x)] =
                 local_900.p[lVar14 + lVar19 + (lVar22 - local_900.begin.x)] * 10.0;
            lVar22 = lVar22 + 1;
            pdVar24 = pdVar24 + 1;
            pdVar33 = pdVar33 + 1;
          } while (local_be4.bigend.vect[0] + 1 != (int)lVar22);
        }
        local_d10 = local_d10 + CONCAT44(local_b48.jstride._4_4_,(int)local_b48.jstride);
        local_d18 = local_d18 + local_c98._8_8_;
      }
      local_cf0 = local_cf0 + CONCAT44(local_b48.kstride._4_4_,(int)local_b48.kstride);
      local_cf8 = local_cf8 + local_c98._16_8_;
      local_c18 = lVar20;
      lVar35 = lVar20 + 1;
    }
    time_chem = 0.0;
    dt_incr = dt;
    (**(code **)(*(long *)m_reactor._M_t.
                          super___uniq_ptr_impl<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_pele::physics::reactions::ReactorBase_*,_std::default_delete<pele::physics::reactions::ReactorBase>_>
                          .super__Head_base<0UL,_pele::physics::reactions::ReactorBase_*,_false>.
                          _M_head_impl + 0x28))
              (m_reactor._M_t.
               super___uniq_ptr_impl<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_pele::physics::reactions::ReactorBase_*,_std::default_delete<pele::physics::reactions::ReactorBase>_>
               .super__Head_base<0UL,_pele::physics::reactions::ReactorBase_*,_false>._M_head_impl,
               &local_be4,local_c98,&local_b48,&local_b08,&local_bb0,&local_900,&local_ac8,
               &local_7f0,&dt_incr,&time_chem);
    time_chem = 0.0;
    lVar35 = (long)local_be4.smallend.vect[2];
    pdVar33 = (double *)
              (local_c98._0_8_ +
              (lVar35 - local_c70) * local_c98._16_8_ * 8 +
              ((long)local_be4.smallend.vect[1] - (long)local_c74) * local_c98._8_8_ * 8 +
              (long)local_be4.smallend.vect[0] * 8 + (long)local_c78 * -8);
    for (; lVar35 <= local_be4.bigend.vect[2]; lVar35 = lVar35 + 1) {
      lVar20 = (lVar35 - local_bb0.begin.z) * local_bb0.kstride;
      pdVar24 = pdVar33;
      for (lVar31 = (long)local_be4.smallend.vect[1]; lVar31 <= local_be4.bigend.vect[1];
          lVar31 = lVar31 + 1) {
        if (local_be4.smallend.vect[0] <= local_be4.bigend.vect[0]) {
          lVar14 = (lVar31 - local_bb0.begin.y) * local_bb0.jstride;
          pdVar32 = pdVar24;
          lVar13 = (long)local_be4.smallend.vect[0];
          do {
            lVar22 = 9;
            pdVar25 = pdVar32;
            while (bVar40 = lVar22 != 0, lVar22 = lVar22 + -1, bVar40) {
              *pdVar25 = *pdVar25 * 1000.0;
              pdVar25 = pdVar25 + local_c98._24_8_;
            }
            local_bb0.p[lVar20 + lVar14 + (lVar13 - local_bb0.begin.x)] =
                 (double)((double)local_bb0.p[lVar20 + lVar14 + (lVar13 - local_bb0.begin.x)] * 0.1)
            ;
            lVar13 = lVar13 + 1;
            pdVar32 = pdVar32 + 1;
          } while (local_be4.bigend.vect[0] + 1 != (int)lVar13);
        }
        pdVar24 = pdVar24 + local_c98._8_8_;
      }
      pdVar33 = pdVar33 + local_c98._16_8_;
    }
    dt_incr = dt;
    amrex::MFIter::operator++(&Smfi);
  }
  amrex::MFIter::~MFIter(&Smfi);
  amrex::FabArray<amrex::FArrayBox>::clear(&FTemp.super_FabArray<amrex::FArrayBox>);
  this = local_c50;
  iVar10 = first_spec;
  pPVar11 = amrex::Periodicity::NonPeriodic();
  amrex::FabArray<amrex::FArrayBox>::ParallelCopy
            (local_bc8,&STemp.super_FabArray<amrex::FArrayBox>,0,iVar10,0xc,pPVar11,COPY);
  amrex::FabArray<amrex::FArrayBox>::clear(&STemp.super_FabArray<amrex::FArrayBox>);
  amrex::MFIter::MFIter(&Smfi,(FabArrayBase *)mf_old,true);
  local_c48 = 1.0 / dt;
  while( true ) {
    _Var8._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)
         (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)local_c58;
    if (Smfi.endIndex <= Smfi.currentIndex) break;
    amrex::MFIter::tilebox((Box *)&local_b48,&Smfi);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((Array4<const_double> *)local_c98,&mf_old->super_FabArray<amrex::FArrayBox>,&Smfi,
               first_spec);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((Array4<const_double> *)&local_bb0,local_bc8,&Smfi,first_spec);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((Array4<const_double> *)&local_b08,&Force->super_FabArray<amrex::FArrayBox>,&Smfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_ac8,
               (FabArray<amrex::FArrayBox> *)
               _Var8._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&Smfi);
    lVar13 = (long)local_b48.p._4_4_;
    local_c20 = (long)(int)local_b48.jstride;
    lVar20 = (long)(int)local_b48.p;
    local_c28 = local_ac8.nstride * 8;
    local_c30 = (undefined **)(local_b08.nstride * 8);
    lVar14 = (lVar13 - local_bb0.begin.y) * local_bb0.jstride * 8 +
             (local_c20 - local_bb0.begin.z) * local_bb0.kstride * 8 + lVar20 * 8 +
             (long)local_bb0.begin.x * -8 + (long)local_bb0.p;
    local_c38 = local_bb0.nstride * 8;
    pcVar28 = (pointer)(local_c98._0_8_ +
                       (lVar13 - local_c74) * local_c98._8_8_ * 8 +
                       (local_c20 - local_c70) * local_c98._16_8_ * 8 + lVar20 * 8 +
                       (long)local_c78 * -8);
    local_c40 = local_c98._24_8_ * 8;
    lVar35 = 0;
    lVar31 = (lVar13 - local_b08.begin.y) * local_b08.jstride * 8 +
             (local_c20 - local_b08.begin.z) * local_b08.kstride * 8 + lVar20 * 8 +
             (long)local_b08.begin.x * -8 + (long)local_b08.p;
    lVar20 = (lVar13 - local_ac8.begin.y) * local_ac8.jstride * 8 +
             (local_c20 - local_ac8.begin.z) * local_ac8.kstride * 8 + lVar20 * 8 +
             (long)local_ac8.begin.x * -8 + (long)local_ac8.p;
    while (lVar36 = lVar20, lVar19 = lVar31, lVar18 = lVar35, lVar35 = lVar14, pcVar29 = pcVar28,
          lVar31 = lVar19, lVar20 = lVar36, lVar22 = local_c20, lVar18 != 9) {
      for (; lVar26 = lVar35, lVar30 = lVar31, lVar34 = lVar20, lVar38 = lVar13, pcVar39 = pcVar29,
          lVar22 <= local_b48.kstride._4_4_; lVar22 = lVar22 + 1) {
        for (; lVar38 <= (int)local_b48.kstride; lVar38 = lVar38 + 1) {
          if ((int)local_b48.p <= local_b48.jstride._4_4_) {
            lVar37 = 0;
            do {
              *(double *)(lVar34 + lVar37 * 8) =
                   -(*(double *)(pcVar39 + lVar37 * 8) - *(double *)(lVar26 + lVar37 * 8)) *
                   local_c48 - *(double *)(lVar30 + lVar37 * 8);
              lVar37 = lVar37 + 1;
            } while ((local_b48.jstride._4_4_ - (int)local_b48.p) + 1 != (int)lVar37);
          }
          lVar34 = lVar34 + local_ac8.jstride * 8;
          lVar30 = lVar30 + local_b08.jstride * 8;
          lVar26 = lVar26 + local_bb0.jstride * 8;
          pcVar39 = pcVar39 + local_c98._8_8_ * 8;
        }
        lVar35 = lVar35 + local_bb0.kstride * 8;
        pcVar29 = pcVar29 + local_c98._16_8_ * 8;
        lVar31 = lVar31 + local_b08.kstride * 8;
        lVar20 = lVar20 + local_ac8.kstride * 8;
      }
      lVar14 = lVar14 + local_c38;
      pcVar28 = pcVar28 + local_c40;
      lVar31 = lVar19 + (long)local_c30;
      this = local_c50;
      lVar20 = lVar36 + local_c28;
      local_c18 = lVar18;
      local_c10 = lVar19;
      local_c08 = lVar36;
      lVar35 = lVar18 + 1;
    }
    amrex::MFIter::operator++(&Smfi);
  }
  amrex::MFIter::~MFIter(&Smfi);
  if (bVar7) {
    std::__cxx11::string::string((string *)&Smfi,"REACTIONS",(allocator *)local_c98);
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
              ::operator[](&this->auxDiag,(key_type *)&Smfi);
    pFVar6 = &((pmVar12->_M_t).
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
              super_FabArray<amrex::FArrayBox>;
    pPVar11 = amrex::Periodicity::NonPeriodic();
    amrex::FabArray<amrex::FArrayBox>::ParallelCopy
              (pFVar6,&diagTemp.super_FabArray<amrex::FArrayBox>,pPVar11,COPY);
    std::__cxx11::string::~string((string *)&Smfi);
    amrex::FabArray<amrex::FArrayBox>::clear(&diagTemp.super_FabArray<amrex::FArrayBox>);
  }
  this_03.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (this->super_NavierStokesBase).super_AmrLevel.state.
       super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
       super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
       super__Vector_impl_data._M_start[FuncCount_Type].new_data._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  iVar10 = ((IntVect *)
           ((long)this_03.
                  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t
                  .super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0))->vect[0];
  if (iVar21 <= iVar10) {
    iVar10 = iVar21;
  }
  pPVar11 = amrex::Periodicity::NonPeriodic();
  amrex::FabArray<amrex::FArrayBox>::ParallelCopy
            ((FabArray<amrex::FArrayBox> *)
             this_03.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
             &fcnCntTemp.super_FabArray<amrex::FArrayBox>,0,0,1,0,iVar10,pPVar11,COPY);
  amrex::FabArray<amrex::FArrayBox>::clear(&fcnCntTemp.super_FabArray<amrex::FArrayBox>);
  _Var8._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)
       (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)local_c58;
  if (bVar41) {
    NavierStokesBase::average_down
              (&this->super_NavierStokesBase,
               *(MultiFab **)
                (*(long *)((long)(((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level)
                                 .
                                 super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                 .
                                 super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start
                                 [(long)(this->super_NavierStokesBase).super_AmrLevel.level + 1].
                                 _M_t.
                                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          + 0x170) + 0xd0 + (long)RhoYdot_Type * 0xe0),
               (MultiFab *)
               local_c58._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0,9);
  }
  if (0 < iVar21) {
    this_00 = &(this->super_NavierStokesBase).super_AmrLevel.geom;
    PVar43 = amrex::Geometry::periodicity(this_00);
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ =
         (undefined1)PVar43.period.vect[0];
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ =
         PVar43.period.vect._1_7_;
    Smfi.fabArray._0_4_ = PVar43.period.vect[2];
    amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
              ((FabArray<amrex::FArrayBox> *)
               _Var8._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0,9,(Periodicity *)&Smfi
               ,false);
    amrex::Extrapolater::FirstOrderExtrap
              ((MultiFab *)
               _Var8._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,this_00,0,9,
               (((FabArrayBase *)
                _Var8._M_t.
                super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->n_grow).vect[0]);
  }
  amrex::FabArray<amrex::BaseFab<int>_>::~FabArray(&react_mask);
  amrex::MultiFab::~MultiFab(&diagTemp);
  amrex::MultiFab::~MultiFab(&fcnCntTemp);
  amrex::MultiFab::~MultiFab(&FTemp);
  amrex::MultiFab::~MultiFab(&STemp);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&dm.m_ref.
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  amrex::BoxArray::~BoxArray(&ba);
  amrex::BoxArray::~BoxArray(&cf_grids);
LAB_00191e53:
  if (2 < NavierStokesBase::verbose) {
    dVar42 = amrex::ParallelDescriptor::second();
    poVar15 = amrex::OutStream();
    amrex::Print::Print((Print *)&Smfi,poVar15);
    std::operator<<((ostream *)&Smfi.tile_size,"      PeleLM::advance_chemistry(): lev: ");
    pPVar16 = amrex::Print::operator<<
                        ((Print *)&Smfi,&(this->super_NavierStokesBase).super_AmrLevel.level);
    poVar23 = &pPVar16->ss;
    std::operator<<((ostream *)poVar23,", time: [");
    dVar42 = dVar42 - local_b70;
    std::ostream::_M_insert<double>(dVar42);
    std::operator<<((ostream *)poVar23," ... ");
    std::ostream::_M_insert<double>(dVar42);
    std::operator<<((ostream *)poVar23,"]\n");
    amrex::Print::~Print((Print *)&Smfi);
  }
  return;
}

Assistant:

void
PeleLM::advance_chemistry (MultiFab&       mf_old,
                           MultiFab&       mf_new,
                           Real            dt,
                           const MultiFab& Force)
{
  BL_PROFILE("PLM::advance_chemistry()");

  const Real strt_time = ParallelDescriptor::second();

  const bool do_avg_down_chem = avg_down_chem
    && level < parent->finestLevel()
    && getLevel(level+1).state[RhoYdot_Type].hasOldData();

  if (hack_nochem)
  {
    MultiFab::Copy(mf_new,mf_old,first_spec,first_spec,NUM_SPECIES+2,0);
    MultiFab::Saxpy(mf_new,dt,Force,0,first_spec,NUM_SPECIES+1,0);
    get_new_data(RhoYdot_Type).setVal(0);
    get_new_data(FuncCount_Type).setVal(0);
  }
  else
  {
    BoxArray cf_grids;

    if (do_avg_down_chem)
    {
      cf_grids = getLevel(level+1).boxArray(); cf_grids.coarsen(fine_ratio);
    }

    MultiFab&  React_new = get_new_data(RhoYdot_Type);
    const int  ngrow     = std::min(std::min(React_new.nGrow(),mf_old.nGrow()),mf_new.nGrow());

    BoxArray  ba           = mf_new.boxArray();
    DistributionMapping dm = mf_new.DistributionMap();
#ifndef AMREX_USE_GPU
    //
    // Chop the grids to level out the chemistry work when on the CPU.
    // We want enough grids so that KNAPSACK works well,
    // but not too many to make unweildy BoxArrays.
    //
    const int Threshold = chem_box_chop_threshold * ParallelDescriptor::NProcs();
    bool      done      = (ba.size() >= Threshold);

    for (int cnt = 1; !done; cnt *= 2)
    {
      const IntVect ChunkSize = parent->maxGridSize(level)/cnt;

      if ( AMREX_D_TERM(ChunkSize[0] < 16, || ChunkSize[1] < 16, || ChunkSize[2] < 16) )
        //
        // Don't let grids get too small.
        //
        break;

      IntVect chunk(ChunkSize);

      for (int j = AMREX_SPACEDIM-1; j >=0 && ba.size() < Threshold; j--)
      {
        chunk[j] /= 2;
        ba.maxSize(chunk);
        if (ba.size() >= Threshold) done = true;
      }
    }

    dm = getFuncCountDM(ba,ngrow);
#endif

    MultiFab STemp(ba, dm, NUM_SPECIES+3, 0);
    MultiFab FTemp(ba, dm, Force.nComp(), 0);

    STemp.ParallelCopy(mf_old,first_spec,0,NUM_SPECIES+3); // Parallel copy.
    FTemp.ParallelCopy(Force);                          // Parallel copy.

    MultiFab fcnCntTemp(ba, dm, 1, 0);
    MultiFab diagTemp;

    // Setup a mask for chemistry. Right used only for EB.
    // TODO: find a way to set that up properly when running boxes on GPU.
    amrex::FabArray<amrex::BaseFab<int>>  react_mask;
    react_mask.define(ba, dm,  1, 0);
#ifdef AMREX_USE_EB
    react_mask.ParallelCopy(ebmask);
#else
    react_mask.setVal(1);
#endif

    const bool do_diag = plot_reactions && amrex::intersect(ba,auxDiag["REACTIONS"]->boxArray()).size() != 0;

    if (do_diag)
    {
        diagTemp.define(ba, dm, auxDiag["REACTIONS"]->nComp(), 0);
        diagTemp.ParallelCopy(*auxDiag["REACTIONS"]); // Parallel copy
    }

    if (verbose > 2)
      amrex::Print() << "      PeleLM::advance_chemistry() FABs in tmp MF: " << STemp.size() << '\n';

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter Smfi(STemp,amrex::TilingIfNotGPU()); Smfi.isValid(); ++Smfi)
    {
        const Box& bx       = Smfi.tilebox();
        auto const& rhoY     = STemp.array(Smfi);
        auto const& rhoH     = STemp.array(Smfi,NUM_SPECIES);
        auto const& temp     = STemp.array(Smfi,NUM_SPECIES+1);
        auto const& fcl      = fcnCntTemp.array(Smfi);
        auto const& frc_rhoY = FTemp.array(Smfi);
        auto const& frc_rhoH = FTemp.array(Smfi, NUM_SPECIES);
        auto const& mask     = react_mask.array(Smfi);

        // Convert MKS -> CGS
        ParallelFor(bx, [rhoY,rhoH, frc_rhoY, frc_rhoH]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
           for (int n = 0; n < NUM_SPECIES; n++) {
              rhoY(i,j,k,n) *= 1.0e-3;
              frc_rhoY(i,j,k,n) *= 1.0e-3;
           }
           rhoH(i,j,k) *= 10.0;
           frc_rhoH(i,j,k) *= 10.0;
        });

        BL_PROFILE_VAR("React()", ReactInLoop);
        Real dt_incr     = dt;
        Real time_chem   = 0;
        /* Solve */
        m_reactor->react(bx, rhoY, frc_rhoY, temp,
                         rhoH, frc_rhoH, fcl,
                         mask, dt_incr, time_chem
#ifdef AMREX_USE_GPU
                         , amrex::Gpu::gpuStream()
#endif
                         );
        dt_incr   = dt;
        time_chem = 0;
        BL_PROFILE_VAR_STOP(ReactInLoop);

        // Convert CGS -> MKS
        ParallelFor(bx, [rhoY,rhoH]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
           for (int n = 0; n < NUM_SPECIES; n++) {
              rhoY(i,j,k,n) *= 1.0e3;
           }
           rhoH(i,j,k) *= 0.1;
        });

#ifdef AMREX_USE_GPU
        Gpu::Device::streamSynchronize();
#endif
    }

    FTemp.clear();

    mf_new.ParallelCopy(STemp,0,first_spec,NUM_SPECIES+3); // Parallel copy.

    STemp.clear();

    //
    // Set React_new (I_R).
    //
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf_old,amrex::TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx         = mfi.tilebox();
        auto const& rhoY_o    = mf_old.const_array(mfi,first_spec);
        auto const& rhoY_n    = mf_new.const_array(mfi,first_spec);
        auto const& frc_rhoY  = Force.const_array(mfi);
        auto const& rhoYdot   = React_new.array(mfi);
        Real dt_inv = 1.0/dt;
        ParallelFor(bx, NUM_SPECIES, [rhoY_o, rhoY_n, frc_rhoY, rhoYdot, dt_inv]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
           rhoYdot(i,j,k,n) = - ( rhoY_o(i,j,k,n) - rhoY_n(i,j,k,n) ) * dt_inv - frc_rhoY(i,j,k,n);
        });
    }

    if (do_diag)
    {
      auxDiag["REACTIONS"]->ParallelCopy(diagTemp); // Parallel copy
      diagTemp.clear();
    }

    MultiFab& FC = get_new_data(FuncCount_Type);
    FC.ParallelCopy(fcnCntTemp,0,0,1,0,std::min(ngrow,FC.nGrow()));
    fcnCntTemp.clear();
    //
    // Approximate covered crse chemistry (I_R) with averaged down fine I_R from previous time step.
    //
    if (do_avg_down_chem)
    {
      MultiFab& fine_React = getLevel(level+1).get_old_data(RhoYdot_Type);
      average_down(fine_React, React_new, 0, NUM_SPECIES);
    }
    //
    // Ensure consistent grow cells.
    //
    if (ngrow > 0)
    {
      React_new.FillBoundary(0,NUM_SPECIES, geom.periodicity());
      Extrapolater::FirstOrderExtrap(React_new, geom, 0, NUM_SPECIES, React_new.nGrow());
    }
  }

  if (verbose > 2)
  {
    const int IOProc = ParallelDescriptor::IOProcessorNumber();

    Real mx = ParallelDescriptor::second() - strt_time, mn = mx;

    ParallelDescriptor::ReduceRealMin(mn,IOProc);
    ParallelDescriptor::ReduceRealMax(mx,IOProc);

    amrex::Print() << "      PeleLM::advance_chemistry(): lev: " << level << ", time: ["
                   << mn << " ... " << mx << "]\n";
  }
}